

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

unique_ptr<pbrt::LightPathIntegrator,_std::default_delete<pbrt::LightPathIntegrator>_>
pbrt::LightPathIntegrator::Create
          (ParameterDictionary *parameters,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,FileLoc *loc)

{
  int iVar1;
  allocator<char> local_61;
  FileLoc *local_60;
  int maxDepth;
  string local_50;
  
  local_60 = loc;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"maxdepth",&local_61);
  iVar1 = ParameterDictionary::GetOneInt((ParameterDictionary *)camera,&local_50,5);
  std::__cxx11::string::~string((string *)&local_50);
  maxDepth = iVar1;
  std::
  make_unique<pbrt::LightPathIntegrator,int&,pbrt::CameraHandle&,pbrt::SamplerHandle&,pbrt::PrimitiveHandle&,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&>
            ((int *)parameters,(CameraHandle *)&maxDepth,sampler,aggregate,lights);
  return (__uniq_ptr_data<pbrt::LightPathIntegrator,_std::default_delete<pbrt::LightPathIntegrator>,_true,_true>
          )(__uniq_ptr_data<pbrt::LightPathIntegrator,_std::default_delete<pbrt::LightPathIntegrator>,_true,_true>
            )parameters;
}

Assistant:

std::unique_ptr<LightPathIntegrator> LightPathIntegrator::Create(
    const ParameterDictionary &parameters, CameraHandle camera, SamplerHandle sampler,
    PrimitiveHandle aggregate, std::vector<LightHandle> lights, const FileLoc *loc) {
    int maxDepth = parameters.GetOneInt("maxdepth", 5);
    return std::make_unique<LightPathIntegrator>(maxDepth, camera, sampler, aggregate,
                                                 lights);
}